

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicFileSystem.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
Diligent::SplitPath<std::__cxx11::string>
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,Diligent *this,Char *Path,bool Simplify)

{
  Diligent DVar1;
  pointer pbVar2;
  char cVar3;
  bool bVar4;
  Diligent *pDVar5;
  long lVar6;
  size_type __n;
  char *pcVar7;
  Char *c;
  Char *CmpStart;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pDVar5 = this + 1;
  __n = 1;
  do {
    DVar1 = pDVar5[-1];
    if ((DVar1 == (Diligent)0x2f) || (DVar1 == (Diligent)0x5c)) {
      __n = __n + (*pDVar5 != (Diligent)0x5c && *pDVar5 != (Diligent)0x2f);
    }
    else if (DVar1 == (Diligent)0x0) break;
    pDVar5 = pDVar5 + 1;
  } while( true );
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(__return_storage_ptr__,__n);
  c = (Char *)this;
  do {
    while( true ) {
      cVar3 = *c;
      if (cVar3 == '\0') {
        return __return_storage_ptr__;
      }
      while ((CmpStart = c, pcVar7 = c + 1, cVar3 == '/' || (cVar3 == '\\'))) {
        c = pcVar7;
        cVar3 = *pcVar7;
      }
      if (cVar3 == '\0') {
        return __return_storage_ptr__;
      }
      lVar6 = 0;
      for (; ((cVar3 = *c, cVar3 != '\0' && (cVar3 != '/')) && (cVar3 != '\\')); c = c + 1) {
        lVar6 = lVar6 + 1;
      }
      if ((char)Path == '\0') break;
      if (lVar6 == 2) {
        if (((*CmpStart != '.') || (*pcVar7 != '.')) ||
           ((pbVar2 = (__return_storage_ptr__->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish,
            (__return_storage_ptr__->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start == pbVar2 ||
            (bVar4 = std::operator!=(pbVar2 + -1,".."), !bVar4)))) break;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_back(__return_storage_ptr__);
      }
      else if ((lVar6 != 1) || (*CmpStart != '.')) break;
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*const&,char_const*&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,&CmpStart,&c);
  } while( true );
}

Assistant:

std::vector<StringType> SplitPath(const Char* Path, bool Simplify)
{
    std::vector<StringType> Components;

    // BasicFileSystem::IsSlash() does not get inlined by at least MSVC
    auto IsSlash = [](Char c) {
        return c == '/' || c == '\\';
    };

    // Estimate the number of components and reserve space in the vector
    {
        size_t CompnentCount = 1;
        for (const auto* c = Path; *c != '\0'; ++c)
        {
            if (IsSlash(c[0]) && !IsSlash(c[1]))
                ++CompnentCount;
        }
        Components.reserve(CompnentCount);
    }

    const auto* c = Path;
    while (*c != '\0')
    {
        while (IsSlash(*c))
            ++c;

        if (*c == '\0')
        {
            // a/
            break;
        }

        const auto* const CmpStart = c;
        while (*c != '\0' && !IsSlash(*c))
            ++c;

        if (Simplify)
        {
            if ((c - CmpStart) == 1 && CmpStart[0] == '.') // "."
            {
                // Skip /.
                continue;
            }
            else if ((c - CmpStart) == 2 && CmpStart[0] == '.' && CmpStart[1] == '.') // ".."
            {
                // Pop previous subdirectory if "/.." is found, but only if there is
                // no ".." already (e.g "../..")
                if (!Components.empty() && Components.back() != "..")
                {
                    Components.pop_back();
                    continue;
                }
            }
        }

        Components.emplace_back(CmpStart, c);
    }

    return Components;
}